

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O3

int fy_diag_vprintf(fy_diag *diag,char *fmt,__va_list_tag *ap)

{
  FILE *__s;
  int iVar1;
  char *in_RAX;
  char *buf;
  char *local_18;
  
  iVar1 = -1;
  if ((fmt != (char *)0x0 && diag != (fy_diag *)0x0) && (iVar1 = 0, (diag->field_0x3c & 2) == 0)) {
    __s = (FILE *)(diag->cfg).fp;
    if (__s != (FILE *)0x0) {
      iVar1 = vfprintf(__s,fmt,ap);
      return iVar1;
    }
    iVar1 = -1;
    if ((diag->cfg).output_fn != (fy_diag_output_fn)0x0) {
      local_18 = in_RAX;
      iVar1 = vasprintf(&local_18,fmt,ap);
      if (-1 < iVar1) {
        (*(diag->cfg).output_fn)(diag,(diag->cfg).user,local_18,(size_t)iVar1);
        free(local_18);
      }
    }
  }
  return iVar1;
}

Assistant:

int fy_diag_vprintf(struct fy_diag *diag, const char *fmt, va_list ap) {
    char *buf;
    int rc;

    if (!diag || !fmt)
        return -1;

    /* no more output */
    if (diag->destroyed)
        return 0;

    if (diag->cfg.fp)
        return vfprintf(diag->cfg.fp, fmt, ap);

    if (diag->cfg.output_fn) {
        rc = vasprintf(&buf, fmt, ap);
        if (rc < 0)
            return rc;
        diag->cfg.output_fn(diag, diag->cfg.user, buf, (size_t) rc);
        free(buf);
        return rc;
    }

    return -1;
}